

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore.cpp
# Opt level: O0

void __thiscall
QSystemSemaphore::setNativeKey
          (QSystemSemaphore *this,QNativeIpcKey *key,int initialValue,AccessMode mode)

{
  bool bVar1;
  Type TVar2;
  Type TVar3;
  pointer pQVar4;
  int in_ECX;
  int in_EDX;
  QNativeIpcKey *in_RSI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff38;
  Type in_stack_ffffffffffffff3c;
  undefined2 in_stack_ffffffffffffff3e;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QNativeIpcKey *in_stack_ffffffffffffff48;
  int fieldWidth;
  AccessMode mode_00;
  QLatin1String *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5e;
  QChar fillChar;
  QChar local_4a;
  QLatin1StringView local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
  operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_> *)
             0x264e37);
  bVar1 = ::operator==((QNativeIpcKey *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (QNativeIpcKey *)
                       CONCAT26(in_stack_ffffffffffffff3e,
                                CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)));
  if ((!bVar1) || (in_ECX != 0)) {
    QNativeIpcKey::type(in_RSI);
    bVar1 = isKeyTypeSupported(in_stack_ffffffffffffff3c);
    if (bVar1) {
      std::unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
      operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                  *)0x264f82);
      QSystemSemaphorePrivate::clearError
                ((QSystemSemaphorePrivate *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      std::unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
      operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                  *)0x264f94);
      QSystemSemaphorePrivate::cleanHandle((QSystemSemaphorePrivate *)0x264f9c);
      TVar2 = QNativeIpcKey::type(in_RSI);
      pQVar4 = std::
               unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
               operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                           *)0x264fb5);
      TVar3 = QNativeIpcKey::type(&pQVar4->nativeKey);
      if (TVar2 == TVar3) {
        std::unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
        operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                    *)0x264fde);
        QNativeIpcKey::operator=
                  (in_stack_ffffffffffffff48,
                   (QNativeIpcKey *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        mode_00 = (AccessMode)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      }
      else {
        std::unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
        operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                    *)0x264ff7);
        QSystemSemaphorePrivate::destructBackend((QSystemSemaphorePrivate *)0x264fff);
        std::unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
        operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                    *)0x265013);
        QNativeIpcKey::operator=
                  (in_RSI,(QNativeIpcKey *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        mode_00 = (AccessMode)((ulong)in_RSI >> 0x20);
        std::unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
        operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                    *)0x26502a);
        QSystemSemaphorePrivate::constructBackend((QSystemSemaphorePrivate *)0x265032);
      }
      pQVar4 = std::
               unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
               operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                           *)0x265044);
      pQVar4->initialValue = in_EDX;
      std::unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
      operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                  *)0x265055);
      QSystemSemaphorePrivate::handle((QSystemSemaphorePrivate *)0x265061,mode_00);
    }
    else {
      std::unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
      operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                  *)0x264e7a);
      fillChar.ucs = (char16_t)((uint)in_EDX >> 0x10);
      tr((char *)in_stack_ffffffffffffff48,
         (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
         CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c));
      local_48 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_ffffffffffffff48,
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      fieldWidth = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      QChar::QChar<char16_t,_true>(&local_4a,L' ');
      QString::arg<QLatin1String,_true>
                ((QString *)CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff50,fieldWidth,fillChar);
      QSystemSemaphorePrivate::setError
                ((QSystemSemaphorePrivate *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 CONCAT22(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c),(QString *)0x264f12);
      QString::~QString((QString *)0x264f21);
      QString::~QString((QString *)0x264f2e);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSystemSemaphore::setNativeKey(const QNativeIpcKey &key, int initialValue, AccessMode mode)
{
    if (key == d->nativeKey && mode == Open)
        return;
    if (!isKeyTypeSupported(key.type())) {
        d->setError(KeyError, tr("%1: unsupported key type")
                    .arg("QSystemSemaphore::setNativeKey"_L1));
        return;
    }

    d->clearError();
    d->cleanHandle();
    if (key.type() == d->nativeKey.type()) {
        // we can reuse the backend
        d->nativeKey = key;
    } else {
        // we must recreate the backend
        d->destructBackend();
        d->nativeKey = key;
        d->constructBackend();
    }
    d->initialValue = initialValue;
    d->handle(mode);
}